

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaGrammar::addAnnotation(SchemaGrammar *this,XSAnnotation *annotation)

{
  XSAnnotation *this_00;
  XSAnnotation *lAnnot;
  XSAnnotation *annotation_local;
  SchemaGrammar *this_local;
  
  this_00 = RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::get
                      (this->fAnnotations,this);
  if (this_00 == (XSAnnotation *)0x0) {
    RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::put
              (this->fAnnotations,this,annotation);
  }
  else {
    XSAnnotation::setNext(this_00,annotation);
  }
  return;
}

Assistant:

void SchemaGrammar::addAnnotation(XSAnnotation* const annotation)
{
    XSAnnotation* lAnnot = fAnnotations->get(this);

    if (lAnnot)
        lAnnot->setNext(annotation);
    else
        fAnnotations->put(this, annotation);
}